

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_barrier.cpp
# Opt level: O2

int __thiscall SharedBarrier::init(SharedBarrier *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ContextManager *pCVar2;
  pthread_barrierattr_t barrierattr;
  string local_40;
  
  iVar1 = pthread_barrierattr_init((pthread_barrierattr_t *)&barrierattr);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to initialize barrierattr: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  iVar1 = pthread_barrierattr_setpshared((pthread_barrierattr_t *)&barrierattr,1);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to set PTHREAD_PROCESS_SHARED to barrierattr: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  iVar1 = pthread_barrier_init
                    ((pthread_barrier_t *)
                     ((this->barrier_)._M_t.
                      super___uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                      .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>.
                     _M_head_impl)->ptr_,(pthread_barrierattr_t *)&barrierattr,(uint)ctx);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to initialize barrier: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  iVar1 = pthread_barrierattr_destroy((pthread_barrierattr_t *)&barrierattr);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_40,"Failed to destroy barrierattr: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_40);
    iVar1 = std::__cxx11::string::~string((string *)&local_40);
  }
  return iVar1;
}

Assistant:

void SharedBarrier::init(uint32_t count) {
    pthread_barrierattr_t barrierattr;
    if (pthread_barrierattr_init(&barrierattr) != 0) {
        die(format("Failed to initialize barrierattr: %m"));
    }
    if (pthread_barrierattr_setpshared(&barrierattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to barrierattr: %m"));
    }
    if (pthread_barrier_init(barrier_->get(), &barrierattr, count)) {
        die(format("Failed to initialize barrier: %m"));
    }
    if (pthread_barrierattr_destroy(&barrierattr) != 0) {
        die(format("Failed to destroy barrierattr: %m"));
    }
}